

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

void do_close(uv_tcp_t *handle)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_os_fd_t fd;
  
  if (shutdown_before_close == 2) {
    iVar1 = uv_fileno(handle,&fd);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_b = -1;
      if (fd == -1) {
        pcVar3 = "!=";
        pcVar4 = "(-1)";
        pcVar2 = "(uintptr_t) fd";
        uVar5 = 0x52;
        eval_a = -1;
      }
      else {
        iVar1 = shutdown(fd,2);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_tcp_close_reset(handle,close_cb);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) goto LAB_001865dd;
          pcVar3 = "==";
          pcVar4 = "0";
          pcVar2 = "uv_tcp_close_reset(handle, close_cb)";
          uVar5 = 0x58;
        }
        else {
          pcVar3 = "==";
          pcVar4 = "0";
          pcVar2 = "shutdown(fd, SHUT_RDWR)";
          uVar5 = 0x56;
        }
      }
    }
    else {
      pcVar3 = "==";
      pcVar4 = "0";
      pcVar2 = "r";
      uVar5 = 0x51;
    }
  }
  else if (shutdown_before_close == 1) {
    iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = -0x16;
      iVar1 = uv_tcp_close_reset(handle,close_cb);
      eval_b = (int64_t)iVar1;
      if (eval_b == -0x16) {
LAB_001865dd:
        uv_close(&tcp_server,0);
        return;
      }
      pcVar3 = "==";
      pcVar4 = "uv_tcp_close_reset(handle, close_cb)";
      pcVar2 = "UV_EINVAL";
      uVar5 = 0x4e;
    }
    else {
      pcVar3 = "==";
      pcVar4 = "0";
      pcVar2 = "uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)";
      uVar5 = 0x4d;
    }
  }
  else {
    iVar1 = uv_tcp_close_reset(handle,close_cb);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      eval_a = -0x6b;
      iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
      eval_b = (int64_t)iVar1;
      if (eval_b == -0x6b) goto LAB_001865dd;
      pcVar3 = "==";
      pcVar4 = "uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)";
      pcVar2 = "UV_ENOTCONN";
      uVar5 = 0x5c;
    }
    else {
      pcVar3 = "==";
      pcVar4 = "0";
      pcVar2 = "uv_tcp_close_reset(handle, close_cb)";
      uVar5 = 0x5a;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-reset.c"
          ,uVar5,pcVar2,pcVar3,pcVar4,eval_a,pcVar3,eval_b);
  abort();
}

Assistant:

static void do_close(void* handle) {
  close_cb_called = 0;
  uv_close((uv_handle_t*)handle, close_cb);
  ASSERT_OK(close_cb_called);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, close_cb_called);
}